

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.h
# Opt level: O0

VarSet * __thiscall libDAI::IJGP::Bucket::vars(Bucket *this)

{
  size_type sVar1;
  VarSet *in_RSI;
  VarSet *in_RDI;
  size_t i;
  VarSet *result;
  VarSet *in_stack_ffffffffffffffb0;
  size_type sVar2;
  undefined8 local_20;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar3;
  VarSet *this_00;
  
  uVar3 = 0;
  this_00 = in_RSI;
  VarSet::VarSet(in_stack_ffffffffffffffb0);
  local_20 = 0;
  while (sVar2 = local_20,
        sVar1 = std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
                size((vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                      *)in_RSI), sVar2 < sVar1) {
    std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::operator[]
              ((vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_> *)
               in_RSI,local_20);
    VarSet::operator|=(this_00,(VarSet *)CONCAT17(uVar3,in_stack_ffffffffffffffe8));
    local_20 = local_20 + 1;
  }
  return in_RDI;
}

Assistant:

VarSet vars() {
                        VarSet result;
                        for( size_t i = 0; i < size(); i++ )
                            result |= operator[](i);
                        return result;
                    }